

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySortTree.c
# Opt level: O3

int Delete(BiTree *p)

{
  BiTree __ptr;
  BiTree pBVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  BiTree __ptr_00;
  BiTree pBVar2;
  
  __ptr = *p;
  pBVar1 = __ptr->lChild;
  if (__ptr->rChlid == (BiTNode *)0x0) {
    *p = pBVar1;
    free(__ptr);
    return extraout_EAX_00;
  }
  __ptr_00 = __ptr;
  if (pBVar1 == (BiTree)0x0) {
    *p = __ptr->rChlid;
    free(__ptr);
    return extraout_EAX_01;
  }
  do {
    pBVar2 = __ptr_00;
    __ptr_00 = pBVar1;
    pBVar1 = __ptr_00->rChlid;
  } while (__ptr_00->rChlid != (BiTNode *)0x0);
  __ptr->data = __ptr_00->data;
  pBVar2->lChild = __ptr_00->lChild;
  free(__ptr_00);
  return extraout_EAX;
}

Assistant:

int Delete(BiTree *p){
      BiTree q,s;

      if((*p)->rChlid == NULL){     //右子树为空，重接他的左子树
          q = *p;
          *p = (*p)->lChild;
          free(q);
      } else if((*p)->lChild == NULL){  //左子树为空，重接他的右子树
          q = *p;
          *p = (*p)->rChlid;
          free(q);
      }else{                            //左右子树都部位空
          q = *p;
          s = (*p)->lChild;
          while(s->rChlid){             //找到左子树的最右子树
              q = s;
              s = s->rChlid;
          }

          (*p)->data = s->data;         //s指向被删除结点的直接前驱（将被删除结点的值改为直接前驱结点的值）

          q->lChild = s->lChild;    //重接q的左子树

          free(s);
      }
  }